

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O1

void __thiscall OpenTable::act(OpenTable *this,Restaurant *restaurant)

{
  ActionStatus AVar1;
  uint uVar2;
  pointer pcVar3;
  pointer ppCVar4;
  uint __val;
  uint uVar5;
  bool bVar6;
  Table *this_00;
  long *plVar7;
  vector<Customer_*,_std::allocator<Customer_*>_> *this_01;
  undefined8 *puVar8;
  uint uVar9;
  long *plVar10;
  size_type *psVar11;
  ulong uVar12;
  uint __len;
  pointer ppCVar13;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  this_00 = Restaurant::getTable(restaurant,*(int *)&(this->super_BaseAction).field_0x2c);
  if ((this_00 == (Table *)0x0) || (bVar6 = Table::isOpen(this_00), bVar6)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Table does not exist or is already open\n",0x28);
    Restaurant::logOpenTableMsg_abi_cxx11_(&local_90,restaurant);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x10d0fe);
    plVar10 = plVar7 + 2;
    if ((long *)*plVar7 == plVar10) {
      local_a0 = *plVar10;
      lStack_98 = plVar7[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar10;
      local_b0 = (long *)*plVar7;
    }
    local_a8 = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar10 = plVar7 + 2;
    if ((long *)*plVar7 == plVar10) {
      local_40 = *plVar10;
      lStack_38 = plVar7[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar10;
      local_50 = (long *)*plVar7;
    }
    local_48 = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    (this->super_BaseAction).status = ERROR;
    std::__cxx11::string::operator=
              ((string *)&(this->super_BaseAction).errorMsg,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  else {
    Table::openTable(this_00);
    this_01 = Table::getCustomers(this_00);
    std::vector<Customer_*,_std::allocator<Customer_*>_>::operator=(this_01,&this->customers);
    (this->super_BaseAction).status = COMPLETED;
  }
  AVar1 = (this->super_BaseAction).status;
  if (AVar1 == ERROR) {
    pcVar3 = (this->super_BaseAction).errorMsg._M_dataplus._M_p;
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar3,
               pcVar3 + (this->super_BaseAction).errorMsg._M_string_length);
    std::__cxx11::string::_M_append((char *)&this->completeMessage,(ulong)local_b0);
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
  }
  else {
    if (AVar1 == COMPLETED) {
      uVar2 = *(uint *)&(this->super_BaseAction).field_0x2c;
      __val = -uVar2;
      if (0 < (int)uVar2) {
        __val = uVar2;
      }
      __len = 1;
      if (9 < __val) {
        uVar12 = (ulong)__val;
        uVar5 = 4;
        do {
          __len = uVar5;
          uVar9 = (uint)uVar12;
          if (uVar9 < 100) {
            __len = __len - 2;
            goto LAB_00104aff;
          }
          if (uVar9 < 1000) {
            __len = __len - 1;
            goto LAB_00104aff;
          }
          if (uVar9 < 10000) goto LAB_00104aff;
          uVar12 = uVar12 / 10000;
          uVar5 = __len + 4;
        } while (99999 < uVar9);
        __len = __len + 1;
      }
LAB_00104aff:
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)((int)uVar2 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_70[0] + (uVar2 >> 0x1f),__len,__val);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x10d0fe);
      psVar11 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_90.field_2._M_allocated_capacity = *psVar11;
        local_90.field_2._8_8_ = plVar7[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar11;
        local_90._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_90._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      plVar7 = puVar8 + 2;
      if ((long *)*puVar8 == plVar7) {
        local_a0 = *plVar7;
        lStack_98 = puVar8[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar7;
        local_b0 = (long *)*puVar8;
      }
      local_a8 = puVar8[1];
      *puVar8 = plVar7;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)&this->completeMessage,(string *)&local_b0);
      if (local_b0 != &local_a0) {
        operator_delete(local_b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      ppCVar13 = (this->customers).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppCVar4 = (this->customers).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar13 != ppCVar4) {
        do {
          (*(*ppCVar13)->_vptr_Customer[3])(&local_b0);
          std::__cxx11::string::_M_append((char *)&this->completeMessage,(ulong)local_b0);
          if (local_b0 != &local_a0) {
            operator_delete(local_b0);
          }
          ppCVar13 = ppCVar13 + 1;
        } while (ppCVar13 != ppCVar4);
      }
    }
    std::__cxx11::string::append((char *)&this->completeMessage);
  }
  return;
}

Assistant:

void OpenTable::act(Restaurant &restaurant) {
    Table* temp = restaurant.getTable(tableId);
    if(temp == nullptr || temp->isOpen())
    {
        std::cout << "Table does not exist or is already open\n";
        error("open " + restaurant.logOpenTableMsg() + "Error: Table does not exist or is already open");
    }
    else
    {
        temp->openTable();
        temp->getCustomers() = customers;
        complete();
    }

    if(getStatus() == ActionStatus::COMPLETED)
    {

        completeMessage = "open " + std::to_string(tableId) + " " ;
        for (auto &customer : customers) {
            completeMessage.append(customer->toString());
        }
        completeMessage.append("Completed");
    }
    else  if(getStatus() == ActionStatus::ERROR)
    {
        completeMessage.append(getErrorMsg());
    }
    else completeMessage.append("Pending");

}